

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase1253::run(TestCase1253 *this)

{
  long lVar1;
  ulong uVar2;
  uint i;
  Builder BVar3;
  Reader RVar4;
  ListElementCount local_1c0;
  uint local_1bc;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  Orphan<capnp::Data> orphan2;
  Orphan<capnp::List<unsigned_int,_(capnp::Kind)0>_> orphan;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  reader.reader._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::List<unsigned_int,(capnp::Kind)0>>(&orphan,(Orphanage *)&reader,7);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::apply
            (&builder,&orphan.builder);
  uVar2 = 0;
  for (lVar1 = -7; lVar1 != 0; lVar1 = lVar1 + 1) {
    *(int *)(builder.builder.ptr + (uVar2 >> 3)) = (int)lVar1 + 0x75bcd1c;
    uVar2 = uVar2 + builder.builder.step;
  }
  reader.reader._0_16_ = MessageBuilder::getOrphanage(&message.super_MessageBuilder);
  Orphanage::newOrphan<capnp::Data>(&orphan2,(Orphanage *)&reader,1);
  BVar3 = OrphanBuilder::asData(&orphan2.builder);
  *BVar3.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanGetImpl<unsigned_int,_(capnp::Kind)0>::truncateListOf(&orphan.builder,0xb);
  OrphanGetImpl<capnp::List<unsigned_int,_(capnp::Kind)0>,_(capnp::Kind)6>::applyReader
            (&reader,&orphan.builder);
  if ((reader.reader.elementCount != 0xb) && (kj::_::Debug::minSeverity < 3)) {
    local_1bc = 0xb;
    local_1c0 = reader.reader.elementCount;
    kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4f3,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",(int *)&local_1bc,
               &local_1c0);
  }
  for (lVar1 = 0; lVar1 != 7; lVar1 = lVar1 + 1) {
    uVar2 = (ulong)reader.reader.step * lVar1 >> 3;
    if (kj::_::Debug::minSeverity < 3 &&
        lVar1 + 0x75bcd15U != (ulong)*(uint *)(reader.reader.ptr + uVar2)) {
      local_1bc = (int)lVar1 + 0x75bcd15;
      local_1c0 = *(ListElementCount *)(reader.reader.ptr + uVar2);
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f6,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&local_1bc,
                 &local_1c0);
    }
    uVar2 = lVar1 * (ulong)builder.builder.step >> 3;
    if ((*(int *)(builder.builder.ptr + uVar2) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1bc = 0;
      local_1c0 = *(ListElementCount *)(builder.builder.ptr + uVar2);
      kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f7,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_1bc,&local_1c0)
      ;
    }
  }
  for (lVar1 = 7; lVar1 != 0xb; lVar1 = lVar1 + 1) {
    uVar2 = (ulong)reader.reader.step * lVar1 >> 3;
    if ((*(int *)(reader.reader.ptr + uVar2) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1bc = 0;
      local_1c0 = *(ListElementCount *)(reader.reader.ptr + uVar2);
      kj::_::Debug::log<char_const(&)[36],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4fa,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",(int *)&local_1bc,&local_1c0);
    }
  }
  builder.builder.ptr[0] = 'A';
  builder.builder.ptr[1] = '\x01';
  builder.builder.ptr[2] = '\0';
  builder.builder.ptr[3] = '\0';
  if ((*(ListElementCount *)reader.reader.ptr != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
    local_1bc = 0x75bcd15;
    local_1c0 = *(ListElementCount *)reader.reader.ptr;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x500,ERROR,
               "\"failed: expected \" \"(123456789) == (reader[0])\", 123456789, reader[0]",
               (char (*) [44])"failed: expected (123456789) == (reader[0])",(int *)&local_1bc,
               &local_1c0);
  }
  RVar4 = OrphanBuilder::asDataReader(&orphan2.builder);
  if ((*RVar4.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_1bc = 0x20;
    RVar4 = OrphanBuilder::asDataReader(&orphan2.builder);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x502,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_1bc
               ,RVar4.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  OrphanBuilder::~OrphanBuilder(&orphan2.builder);
  OrphanBuilder::~OrphanBuilder(&orphan.builder);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveListCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(123456789, reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}